

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void __thiscall cimg_library::CImgDisplay::_handle_events(CImgDisplay *this,XEvent *pevent)

{
  Display *pDVar1;
  int iVar2;
  bool is_pressed;
  uint button;
  char tmp_1;
  char tmp;
  XEvent event;
  KeySym ksym;
  undefined1 local_189;
  timespec local_188;
  int local_178 [10];
  int local_150;
  int local_148;
  int local_144;
  uint local_140;
  uint local_13c;
  int local_138;
  int local_134;
  uint local_124;
  uint local_b8 [23];
  int local_5c;
  
  if ((cimg::X11_attr()::val == '\0') &&
     (iVar2 = __cxa_guard_acquire(&cimg::X11_attr()::val), iVar2 != 0)) {
    cimg::X11_static::X11_static(&cimg::X11_attr::val);
    __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
    __cxa_guard_release(&cimg::X11_attr()::val);
  }
  pDVar1 = cimg::X11_attr::val.display;
  memcpy(local_178,pevent,0xc0);
  switch(local_178[0]) {
  case 2:
    local_188.tv_sec = local_188.tv_sec & 0xffffffffffffff00;
    XLookupString(local_178,&local_188,1,local_b8,0);
    is_pressed = true;
    goto LAB_0018de7d;
  case 3:
    XQueryKeymap(pDVar1,local_b8);
    if ((local_124 < 0x100) &&
       ((*(byte *)((long)local_b8 + (ulong)(local_124 >> 3)) >> (local_124 & 7) & 1) != 0)) {
      return;
    }
    local_189 = 0;
    XLookupString(local_178,&local_189,1,&local_188,0);
    is_pressed = false;
    local_b8[0] = (uint)local_188.tv_sec;
LAB_0018de7d:
    set_key(this,local_b8[0],is_pressed);
    break;
  case 4:
    do {
      this->_mouse_x = local_138;
      this->_mouse_y = local_134;
      if (((local_138 < 0) || (local_134 < 0)) ||
         (((int)this->_width <= local_138 || ((int)this->_height <= local_134)))) {
        this->_mouse_x = -1;
        this->_mouse_y = -1;
      }
      if (local_124 - 1 < 3) {
        set_button(this,*(uint *)(&DAT_0028cd60 + (ulong)(local_124 - 1) * 4),true);
      }
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,4,local_178);
    } while (iVar2 != 0);
    break;
  case 5:
    do {
      this->_mouse_x = local_138;
      this->_mouse_y = local_134;
      if ((((local_138 < 0) || (local_134 < 0)) || ((int)this->_width <= local_138)) ||
         ((int)this->_height <= local_134)) {
        this->_mouse_x = -1;
        this->_mouse_y = -1;
      }
      switch(local_124) {
      case 1:
        button = 1;
        break;
      case 2:
        button = 3;
        break;
      case 3:
        button = 2;
        break;
      case 4:
        iVar2 = 1;
        goto LAB_0018dde4;
      case 5:
        iVar2 = -1;
LAB_0018dde4:
        set_wheel(this,iVar2);
      default:
        goto switchD_0018ddbc_default;
      }
      set_button(this,button,false);
switchD_0018ddbc_default:
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,8,local_178);
    } while (iVar2 != 0);
    break;
  case 6:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x40,local_178);
    } while (iVar2 != 0);
    this->_mouse_x = local_138;
    this->_mouse_y = local_134;
    if (((local_138 < 0) || (local_134 < 0)) ||
       (((int)this->_width <= local_138 || ((int)this->_height <= local_134)))) {
      this->_mouse_x = -1;
      this->_mouse_y = -1;
    }
    this->_is_event = true;
    if ((cimg::X11_attr()::val == '\0') &&
       (iVar2 = __cxa_guard_acquire(&cimg::X11_attr()::val), iVar2 != 0)) {
      cimg::X11_static::X11_static(&cimg::X11_attr::val);
LAB_0018dff2:
      __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
      __cxa_guard_release(&cimg::X11_attr()::val);
    }
    goto LAB_0018dcf3;
  case 7:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x10,local_178);
    } while (iVar2 != 0);
    this->_mouse_x = local_138;
    this->_mouse_y = local_134;
    if ((((local_138 < 0) || (local_134 < 0)) || ((int)this->_width <= local_138)) ||
       ((int)this->_height <= local_134)) {
      this->_mouse_x = -1;
      this->_mouse_y = -1;
    }
    break;
  case 8:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x20,local_178);
    } while (iVar2 != 0);
    this->_mouse_x = -1;
    this->_mouse_y = -1;
    this->_is_event = true;
    if ((cimg::X11_attr()::val == '\0') &&
       (iVar2 = __cxa_guard_acquire(&cimg::X11_attr()::val), iVar2 != 0)) {
      cimg::X11_static::X11_static(&cimg::X11_attr::val);
      goto LAB_0018dff2;
    }
    goto LAB_0018dcf3;
  case 9:
  case 10:
  case 0xb:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    break;
  case 0xc:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x8000,local_178);
    } while (iVar2 != 0);
    _paint(this,false);
    if (this->_is_fullscreen == true) {
      do {
        XGetWindowAttributes(pDVar1,this->_window,local_b8);
        if (local_5c != 2) {
          XSync(pDVar1);
          local_188.tv_sec = 0;
          local_188.tv_nsec = 10000000;
          nanosleep(&local_188,(timespec *)0x0);
        }
      } while (local_5c != 2);
      XSetInputFocus(pDVar1,this->_window,2,0);
    }
    break;
  case 0x16:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x20000,local_178);
    } while (iVar2 != 0);
    if ((local_13c != 0 && local_140 != 0) &&
       ((local_140 != this->_window_width || (local_13c != this->_window_height)))) {
      this->_window_width = local_140;
      this->_window_height = local_13c;
      this->_mouse_x = -1;
      this->_mouse_y = -1;
      XResizeWindow(pDVar1,this->_window);
      this->_is_event = true;
      this->_is_resized = true;
      if ((cimg::X11_attr()::val == '\0') &&
         (iVar2 = __cxa_guard_acquire(&cimg::X11_attr()::val), iVar2 != 0)) {
        cimg::X11_static::X11_static(&cimg::X11_attr::val);
        __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
        __cxa_guard_release(&cimg::X11_attr()::val);
      }
      pthread_cond_broadcast((pthread_cond_t *)&cimg::X11_attr::val.wait_event);
    }
    if ((local_148 == this->_window_x) && (local_144 == this->_window_y)) {
      return;
    }
    this->_window_x = local_148;
    this->_window_y = local_144;
    this->_is_moved = true;
    this->_is_event = true;
    if ((cimg::X11_attr()::val == '\0') &&
       (iVar2 = __cxa_guard_acquire(&cimg::X11_attr()::val), iVar2 != 0)) {
      cimg::X11_static::X11_static(&cimg::X11_attr::val);
      goto LAB_0018dff2;
    }
LAB_0018dcf3:
    pthread_cond_broadcast((pthread_cond_t *)&cimg::X11_attr::val.wait_event);
    break;
  default:
    if (((local_178[0] == 0x21) && (local_150 == (int)this->_wm_protocol_atom)) &&
       (local_140 == (uint)this->_wm_window_atom)) {
      if ((cimg::X11_attr()::val == '\0') &&
         (iVar2 = __cxa_guard_acquire(&cimg::X11_attr()::val), iVar2 != 0)) {
        cimg::X11_static::X11_static(&cimg::X11_attr::val);
        __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
        __cxa_guard_release(&cimg::X11_attr()::val);
      }
      XUnmapWindow(cimg::X11_attr::val.display,this->_window);
      this->_is_event = true;
      this->_is_closed = true;
      if ((cimg::X11_attr()::val == '\0') &&
         (iVar2 = __cxa_guard_acquire(&cimg::X11_attr()::val), iVar2 != 0)) {
        cimg::X11_static::X11_static(&cimg::X11_attr::val);
        __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
        __cxa_guard_release(&cimg::X11_attr()::val);
      }
      pthread_cond_broadcast((pthread_cond_t *)&cimg::X11_attr::val.wait_event);
      return;
    }
  }
  return;
}

Assistant:

void _handle_events(const XEvent *const pevent) {
      Display *const dpy = cimg::X11_attr().display;
      XEvent event = *pevent;
      switch (event.type) {
      case ClientMessage : {
        if ((int)event.xclient.message_type==(int)_wm_protocol_atom &&
            (int)event.xclient.data.l[0]==(int)_wm_window_atom) {
          XUnmapWindow(cimg::X11_attr().display,_window);
          _is_closed = _is_event = true;
          pthread_cond_broadcast(&cimg::X11_attr().wait_event);
        }
      } break;
      case ConfigureNotify : {
        while (XCheckWindowEvent(dpy,_window,StructureNotifyMask,&event)) {}
        const unsigned int nw = event.xconfigure.width, nh = event.xconfigure.height;
        const int nx = event.xconfigure.x, ny = event.xconfigure.y;
        if (nw && nh && (nw!=_window_width || nh!=_window_height)) {
          _window_width = nw; _window_height = nh; _mouse_x = _mouse_y = -1;
          XResizeWindow(dpy,_window,_window_width,_window_height);
          _is_resized = _is_event = true;
          pthread_cond_broadcast(&cimg::X11_attr().wait_event);
        }
        if (nx!=_window_x || ny!=_window_y) {
          _window_x = nx;
          _window_y = ny;
          _is_moved = _is_event = true;
          pthread_cond_broadcast(&cimg::X11_attr().wait_event);
        }
      } break;
      case Expose : {
        while (XCheckWindowEvent(dpy,_window,ExposureMask,&event)) {}
        _paint(false);
        if (_is_fullscreen) {
          XWindowAttributes attr;
          do {
            XGetWindowAttributes(dpy,_window,&attr);
            if (attr.map_state!=IsViewable) { XSync(dpy,0); cimg::sleep(10); }
          } while (attr.map_state!=IsViewable);
          XSetInputFocus(dpy,_window,RevertToParent,CurrentTime);
        }
      } break;
      case ButtonPress : {
        do {
          _mouse_x = event.xmotion.x; _mouse_y = event.xmotion.y;
          if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
          switch (event.xbutton.button) {
          case 1 : set_button(1); break;
          case 3 : set_button(2); break;
          case 2 : set_button(3); break;
          }
        } while (XCheckWindowEvent(dpy,_window,ButtonPressMask,&event));
      } break;
      case ButtonRelease : {
        do {
          _mouse_x = event.xmotion.x; _mouse_y = event.xmotion.y;
          if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
          switch (event.xbutton.button) {
          case 1 : set_button(1,false); break;
          case 3 : set_button(2,false); break;
          case 2 : set_button(3,false); break;
          case 4 : set_wheel(1); break;
          case 5 : set_wheel(-1); break;
          }
        } while (XCheckWindowEvent(dpy,_window,ButtonReleaseMask,&event));
      } break;
      case KeyPress : {
        char tmp = 0; KeySym ksym;
        XLookupString(&event.xkey,&tmp,1,&ksym,0);
        set_key((unsigned int)ksym,true);
      } break;
      case KeyRelease : {
        char keys_return[32];  // Check that the key has been physically unpressed
        XQueryKeymap(dpy,keys_return);
        const unsigned int kc = event.xkey.keycode, kc1 = kc/8, kc2 = kc%8;
        const bool is_key_pressed = kc1>=32?false:(keys_return[kc1]>>kc2)&1;
        if (!is_key_pressed) {
          char tmp = 0; KeySym ksym;
          XLookupString(&event.xkey,&tmp,1,&ksym,0);
          set_key((unsigned int)ksym,false);
        }
      } break;
      case EnterNotify: {
        while (XCheckWindowEvent(dpy,_window,EnterWindowMask,&event)) {}
        _mouse_x = event.xmotion.x;
        _mouse_y = event.xmotion.y;
        if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
      } break;
      case LeaveNotify : {
        while (XCheckWindowEvent(dpy,_window,LeaveWindowMask,&event)) {}
        _mouse_x = _mouse_y = -1; _is_event = true;
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
      } break;
      case MotionNotify : {
        while (XCheckWindowEvent(dpy,_window,PointerMotionMask,&event)) {}
        _mouse_x = event.xmotion.x;
        _mouse_y = event.xmotion.y;
        if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
        _is_event = true;
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
      } break;
      }
    }